

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getIndices(Q3BSPFileParser *this)

{
  int iVar1;
  value_type psVar2;
  reference ppsVar3;
  reference __dest;
  reference __src;
  size_t nIndices;
  size_t Offset;
  sQ3BSPLump *lump;
  Q3BSPFileParser *this_local;
  
  if (this->m_pModel != (Q3BSPModel *)0x0) {
    ppsVar3 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,0xb);
    psVar2 = *ppsVar3;
    iVar1 = psVar2->iOffset;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_pModel->m_Indices,(ulong)(long)psVar2->iSize >> 2);
    __dest = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pModel->m_Indices,0);
    __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,(long)iVar1);
    memcpy(__dest,__src,(long)psVar2->iSize);
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xce,"void Assimp::Q3BSPFileParser::getIndices()");
}

Assistant:

void Q3BSPFileParser::getIndices()
{
    ai_assert(nullptr != m_pModel );

    sQ3BSPLump *lump = m_pModel->m_Lumps[ kMeshVerts ];
    size_t Offset = (size_t) lump->iOffset;
    const size_t nIndices = lump->iSize / sizeof( int );
    m_pModel->m_Indices.resize( nIndices );
    memcpy( &m_pModel->m_Indices[ 0 ], &m_Data[ Offset ], lump->iSize );
}